

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O3

void libtorrent::anon_unknown_22::update_atp
               (shared_ptr<libtorrent::torrent_info> *ti,add_torrent_params *atp)

{
  byte *pbVar1;
  uint *puVar2;
  element_type *peVar3;
  pointer paVar4;
  iterator __position;
  digest32<256L> *pdVar5;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  sha256_hash pad_00;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *pvVar13;
  pointer pwVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar19;
  int64_t iVar20;
  uint uVar21;
  long lVar22;
  iterator __end2;
  long lVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  iterator __begin2;
  pointer __x;
  pointer __x_00;
  vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *this_01;
  bitfield *this_02;
  file_index_t index;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  span<const_libtorrent::digest32<256L>_> leaves;
  span<const_char> sVar27;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch;
  sha256_hash pad;
  sha256_hash computed_root;
  undefined1 local_118 [16];
  pointer local_108;
  vector<bitfield,_file_index_t> *local_f8;
  vector<std::vector<sha256_hash>,_file_index_t> *local_f0;
  ulong local_e8;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  local_e0;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> local_c8;
  undefined1 local_b0 [16];
  pointer local_a0;
  undefined1 local_98 [24];
  uint auStack_80 [4];
  sha256_hash local_70;
  sha256_hash local_50;
  
  peVar3 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __x = (peVar3->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = *(pointer *)
            ((long)&(peVar3->m_urls).
                    super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    .
                    super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    ._M_impl.super__Vector_impl_data + 8);
  local_e0.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(peVar3->m_urls).
                super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                .
                super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(peVar3->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  pvVar13 = &(peVar3->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ;
  (pvVar13->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar13->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (peVar3->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (peVar3->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (peVar3->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (peVar3->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (peVar3->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar3->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0._0_8_ =
       (peVar3->m_nodes).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0._8_8_ =
       (peVar3->m_nodes).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = (peVar3->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (peVar3->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (peVar3->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar3->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = __x;
  local_e0.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = paVar4;
  if (__x != paVar4) {
    do {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&atp->trackers,&__x->url);
      local_98[0] = __x->tier;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      __position._M_current =
           (atp->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (atp->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&atp->tracker_tiers,__position,(int *)local_98);
      }
      else {
        *__position._M_current = (uint)local_98[0];
        (atp->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __x = __x + 1;
    } while (__x != paVar4);
  }
  pwVar14 = local_c8.
            super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((((ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_flags).m_val & 4) != 0) {
    pbVar1 = (byte *)((long)&(atp->flags).m_val + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if (local_c8.
      super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __x_00 = local_c8.
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = &atp->http_seeds;
      if ((__x_00->type == '\x01') || (this_00 = &atp->url_seeds, __x_00->type == '\0')) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&__x_00->url);
      }
      __x_00 = __x_00 + 1;
    } while (__x_00 != pwVar14);
  }
  local_98._16_8_ =
       (atp->dht_nodes).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (atp->dht_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a0;
  local_98[0] = *(byte *)&(atp->dht_nodes).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  local_98[1] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
  local_98[2] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
  local_98[3] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 3);
  local_98[4] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
  local_98[5] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 5);
  local_98[6] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 6);
  local_98[7] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 7);
  local_98[8] = *(undefined1 *)
                 &(atp->dht_nodes).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  local_98[9] = *(undefined1 *)
                 ((long)&(atp->dht_nodes).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1);
  local_98[10] = *(undefined1 *)
                  ((long)&(atp->dht_nodes).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 2);
  local_98[0xb] =
       *(undefined1 *)
        ((long)&(atp->dht_nodes).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 3);
  local_98[0xc] =
       *(undefined1 *)
        ((long)&(atp->dht_nodes).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 4);
  local_98[0xd] =
       *(undefined1 *)
        ((long)&(atp->dht_nodes).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 5);
  local_98[0xe] =
       *(undefined1 *)
        ((long)&(atp->dht_nodes).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 6);
  local_98[0xf] =
       *(undefined1 *)
        ((long)&(atp->dht_nodes).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 7);
  (atp->dht_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
  (atp->dht_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0._8_8_;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = (pointer)0x0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)local_98);
  peVar3 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar3->m_flags).m_val & 0x10) != 0) {
    iVar16 = file_storage::blocks_per_piece(&peVar3->m_files);
    local_118 = (undefined1  [16])0x0;
    local_108 = (pointer)0x0;
    merkle_pad((sha256_hash *)local_98,iVar16,1);
    peVar3 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar16 = file_storage::num_files(&peVar3->m_files);
    local_f0 = &atp->merkle_trees;
    ::std::
    vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
    ::resize(&(atp->merkle_trees).
              super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
             ,(long)iVar16);
    iVar16 = file_storage::num_files(&peVar3->m_files);
    local_f8 = &atp->merkle_tree_mask;
    ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::resize
              (&(atp->merkle_tree_mask).
                super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>,
               (long)iVar16);
    iVar19 = file_storage::file_range(&peVar3->m_files);
    local_e8 = (ulong)iVar19 >> 0x20;
    if (iVar19._begin.m_val.m_val != iVar19._end.m_val.m_val) {
      lVar24 = (long)iVar19._begin.m_val.m_val;
      do {
        index.m_val = (int)lVar24;
        bVar15 = file_storage::pad_file_at(&peVar3->m_files,index);
        if ((!bVar15) && (iVar20 = file_storage::file_size(&peVar3->m_files,index), iVar20 != 0)) {
          sVar27 = torrent_info::piece_layer
                             ((ti->
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,index);
          lVar22 = sVar27.m_len;
          this_01 = (vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *
                    )((local_f0->
                      super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                      ).
                      super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar24);
          lVar23 = lVar22 + 0x1f;
          if (-1 < lVar22) {
            lVar23 = lVar22;
          }
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          reserve((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   *)this_01,lVar23 >> 5);
          if (0 < lVar22) {
            lVar23 = 0;
            do {
              local_70.m_number._M_elems._0_8_ = sVar27.m_ptr + lVar23;
              ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
              emplace_back<char_const*>(this_01,(char **)&local_70);
              lVar23 = lVar23 + 0x20;
            } while (lVar23 < lVar22);
          }
          iVar16 = file_storage::file_num_blocks(&peVar3->m_files,index);
          iVar16 = merkle_num_leafs(iVar16);
          iVar16 = merkle_num_nodes(iVar16);
          iVar17 = file_storage::file_num_pieces(&peVar3->m_files,index);
          iVar18 = merkle_num_leafs(iVar17);
          pdVar5 = *(digest32<256L> **)this_01;
          if (pdVar5 != *(digest32<256L> **)(this_01 + 8)) {
            leaves.m_len = (long)*(digest32<256L> **)(this_01 + 8) - (long)pdVar5 >> 5;
            pad_00.m_number._M_elems[0]._1_1_ = local_98[1];
            pad_00.m_number._M_elems[0]._0_1_ = local_98[0];
            pad_00.m_number._M_elems[0]._2_1_ = local_98[2];
            pad_00.m_number._M_elems[0]._3_1_ = local_98[3];
            pad_00.m_number._M_elems[1]._0_1_ = local_98[4];
            pad_00.m_number._M_elems[1]._1_1_ = local_98[5];
            pad_00.m_number._M_elems[1]._2_1_ = local_98[6];
            pad_00.m_number._M_elems[1]._3_1_ = local_98[7];
            pad_00.m_number._M_elems[2]._1_1_ = local_98[9];
            pad_00.m_number._M_elems[2]._0_1_ = local_98[8];
            pad_00.m_number._M_elems[2]._2_1_ = local_98[10];
            pad_00.m_number._M_elems[2]._3_1_ = local_98[0xb];
            pad_00.m_number._M_elems[3]._0_1_ = local_98[0xc];
            pad_00.m_number._M_elems[3]._1_1_ = local_98[0xd];
            pad_00.m_number._M_elems[3]._2_1_ = local_98[0xe];
            pad_00.m_number._M_elems[3]._3_1_ = local_98[0xf];
            pad_00.m_number._M_elems[4] = local_98._16_4_;
            pad_00.m_number._M_elems[5] = local_98._20_4_;
            pad_00.m_number._M_elems[6] = auStack_80[0];
            pad_00.m_number._M_elems[7] = auStack_80[1];
            leaves.m_ptr = pdVar5;
            merkle_root_scratch(&local_70,leaves,iVar18,pad_00,
                                (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 *)local_118);
            file_storage::root(&local_50,&peVar3->m_files,index);
            auVar26[0] = -((char)local_70.m_number._M_elems[0] ==
                          (char)local_50.m_number._M_elems[0]);
            auVar26[1] = -(local_70.m_number._M_elems[0]._1_1_ ==
                          local_50.m_number._M_elems[0]._1_1_);
            auVar26[2] = -(local_70.m_number._M_elems[0]._2_1_ ==
                          local_50.m_number._M_elems[0]._2_1_);
            auVar26[3] = -(local_70.m_number._M_elems[0]._3_1_ ==
                          local_50.m_number._M_elems[0]._3_1_);
            auVar26[4] = -((char)local_70.m_number._M_elems[1] ==
                          (char)local_50.m_number._M_elems[1]);
            auVar26[5] = -(local_70.m_number._M_elems[1]._1_1_ ==
                          local_50.m_number._M_elems[1]._1_1_);
            auVar26[6] = -(local_70.m_number._M_elems[1]._2_1_ ==
                          local_50.m_number._M_elems[1]._2_1_);
            auVar26[7] = -(local_70.m_number._M_elems[1]._3_1_ ==
                          local_50.m_number._M_elems[1]._3_1_);
            auVar26[8] = -((char)local_70.m_number._M_elems[2] ==
                          (char)local_50.m_number._M_elems[2]);
            auVar26[9] = -(local_70.m_number._M_elems[2]._1_1_ ==
                          local_50.m_number._M_elems[2]._1_1_);
            auVar26[10] = -(local_70.m_number._M_elems[2]._2_1_ ==
                           local_50.m_number._M_elems[2]._2_1_);
            auVar26[0xb] = -(local_70.m_number._M_elems[2]._3_1_ ==
                            local_50.m_number._M_elems[2]._3_1_);
            auVar26[0xc] = -((char)local_70.m_number._M_elems[3] ==
                            (char)local_50.m_number._M_elems[3]);
            auVar26[0xd] = -(local_70.m_number._M_elems[3]._1_1_ ==
                            local_50.m_number._M_elems[3]._1_1_);
            auVar26[0xe] = -(local_70.m_number._M_elems[3]._2_1_ ==
                            local_50.m_number._M_elems[3]._2_1_);
            auVar26[0xf] = -(local_70.m_number._M_elems[3]._3_1_ ==
                            local_50.m_number._M_elems[3]._3_1_);
            auVar25[0] = -((char)local_70.m_number._M_elems[4] ==
                          (char)local_50.m_number._M_elems[4]);
            auVar25[1] = -(local_70.m_number._M_elems[4]._1_1_ ==
                          local_50.m_number._M_elems[4]._1_1_);
            auVar25[2] = -(local_70.m_number._M_elems[4]._2_1_ ==
                          local_50.m_number._M_elems[4]._2_1_);
            auVar25[3] = -(local_70.m_number._M_elems[4]._3_1_ ==
                          local_50.m_number._M_elems[4]._3_1_);
            auVar25[4] = -((char)local_70.m_number._M_elems[5] ==
                          (char)local_50.m_number._M_elems[5]);
            auVar25[5] = -(local_70.m_number._M_elems[5]._1_1_ ==
                          local_50.m_number._M_elems[5]._1_1_);
            auVar25[6] = -(local_70.m_number._M_elems[5]._2_1_ ==
                          local_50.m_number._M_elems[5]._2_1_);
            auVar25[7] = -(local_70.m_number._M_elems[5]._3_1_ ==
                          local_50.m_number._M_elems[5]._3_1_);
            auVar25[8] = -((char)local_70.m_number._M_elems[6] ==
                          (char)local_50.m_number._M_elems[6]);
            auVar25[9] = -(local_70.m_number._M_elems[6]._1_1_ ==
                          local_50.m_number._M_elems[6]._1_1_);
            auVar25[10] = -(local_70.m_number._M_elems[6]._2_1_ ==
                           local_50.m_number._M_elems[6]._2_1_);
            auVar25[0xb] = -(local_70.m_number._M_elems[6]._3_1_ ==
                            local_50.m_number._M_elems[6]._3_1_);
            auVar25[0xc] = -((char)local_70.m_number._M_elems[7] ==
                            (char)local_50.m_number._M_elems[7]);
            auVar25[0xd] = -(local_70.m_number._M_elems[7]._1_1_ ==
                            local_50.m_number._M_elems[7]._1_1_);
            auVar25[0xe] = -(local_70.m_number._M_elems[7]._2_1_ ==
                            local_50.m_number._M_elems[7]._2_1_);
            auVar25[0xf] = -(local_70.m_number._M_elems[7]._3_1_ ==
                            local_50.m_number._M_elems[7]._3_1_);
            auVar25 = auVar25 & auVar26;
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
              local_50.m_number._M_elems[0] = 0xd7;
              aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                        ((error_code_enum *)&local_50);
            }
          }
          this_02 = (local_f8->
                    super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
                    super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar24;
          bitfield::resize(this_02,iVar16,false);
          iVar16 = merkle_first_leaf(iVar18);
          if (0 < iVar17) {
            iVar17 = iVar17 + iVar16;
            _Var6.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 (this_02->m_buf).
                 super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>;
            do {
              uVar21 = 0x80000000 >> ((byte)iVar16 & 0x1f);
              iVar18 = iVar16 + 0x1f;
              if (-1 < iVar16) {
                iVar18 = iVar16;
              }
              puVar2 = (uint *)((long)_Var6.super__Head_base<0UL,_unsigned_int_*,_false>.
                                      _M_head_impl + 4 + (long)(iVar18 >> 5) * 4);
              *puVar2 = *puVar2 | uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8
                                  | uVar21 << 0x18;
              iVar16 = iVar16 + 1;
            } while (iVar16 < iVar17);
          }
        }
        lVar24 = lVar24 + 1;
      } while ((int)lVar24 != (int)local_e8);
    }
    torrent_info::free_piece_layers
              ((ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&atp->comment);
  ::std::__cxx11::string::_M_assign((string *)&atp->created_by);
  peVar3 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  atp->creation_date = peVar3->m_creation_date;
  uVar7 = *(undefined8 *)((peVar3->m_info_hash).v1.m_number._M_elems + 2);
  uVar8 = *(undefined8 *)((peVar3->m_info_hash).v1.m_number._M_elems + 4);
  uVar9 = *(undefined8 *)((peVar3->m_info_hash).v2.m_number._M_elems + 1);
  uVar10 = *(undefined8 *)((peVar3->m_info_hash).v2.m_number._M_elems + 3);
  uVar11 = *(undefined8 *)((peVar3->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)(atp->info_hashes).v1.m_number._M_elems =
       *(undefined8 *)(peVar3->m_info_hash).v1.m_number._M_elems;
  *(undefined8 *)((atp->info_hashes).v1.m_number._M_elems + 2) = uVar7;
  *(undefined8 *)((atp->info_hashes).v1.m_number._M_elems + 4) = uVar8;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 1) = uVar9;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 3) = uVar10;
  *(undefined8 *)((atp->info_hashes).v2.m_number._M_elems + 5) = uVar11;
  (atp->info_hashes).v2.m_number._M_elems[7] = (peVar3->m_info_hash).v2.m_number._M_elems[7];
  peVar3 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var12 = (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (ti->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
  ;
  (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var12;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)local_b0);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::~vector
            (&local_c8);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::~vector(&local_e0);
  return;
}

Assistant:

void update_atp(std::shared_ptr<torrent_info> ti, add_torrent_params& atp)
	{
		// This is a temporary measure until all non info-dict content is parsed
		// here, rather than the torrent_info constructor
		auto drained_state = ti->_internal_drain();
		for (auto const& ae : drained_state.urls)
		{
			atp.trackers.push_back(std::move(ae.url));
			atp.tracker_tiers.push_back(ae.tier);
		}

		if (ti->is_i2p())
			atp.flags |= torrent_flags::i2p_torrent;

		for (auto const& ws : drained_state.web_seeds)
		{
#if TORRENT_ABI_VERSION < 4
			if (ws.type == web_seed_entry::url_seed)
#endif
				atp.url_seeds.push_back(std::move(ws.url));
#if TORRENT_ABI_VERSION < 4
			else if (ws.type == web_seed_entry::http_seed)
				atp.http_seeds.push_back(std::move(ws.url));
#endif
		}

		atp.dht_nodes = std::move(drained_state.nodes);

		if (ti->v2_piece_hashes_verified())
		{
			int const blocks_per_piece = ti->files().blocks_per_piece();
			std::vector<sha256_hash> scratch;
			sha256_hash const pad = merkle_pad(blocks_per_piece, 1);
			file_storage const& fs = ti->files();
			atp.merkle_trees.resize(fs.num_files());
			atp.merkle_tree_mask.resize(fs.num_files());
			for (auto const f : fs.file_range())
			{
				if (fs.pad_file_at(f)) continue;
				if (fs.file_size(f) == 0) continue;
				auto const bytes = ti->piece_layer(f);
				auto& layer = atp.merkle_trees[f];
				layer.reserve(std::size_t(bytes.size() / sha256_hash::size()));
				for (int i = 0; i < bytes.size(); i += int(sha256_hash::size()))
					layer.emplace_back(bytes.data() + i);

				int const full_size = merkle_num_nodes(
					merkle_num_leafs(fs.file_num_blocks(f)));
				int const num_pieces = fs.file_num_pieces(f);
				int const piece_layer_size = merkle_num_leafs(num_pieces);

				if (!layer.empty())
				{
					sha256_hash const computed_root = merkle_root_scratch(layer
						, piece_layer_size
						, pad
						, scratch);
					if (computed_root != fs.root(f))
						aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);
				}

				auto& mask = atp.merkle_tree_mask[f];
				mask.resize(full_size, false);
				for (int i = merkle_first_leaf(piece_layer_size)
					, end = i + num_pieces; i < end; ++i)
				{
					mask.set_bit(i);
				}
			}
			ti->free_piece_layers();
		}

		atp.comment = ti->comment();
		atp.created_by = ti->creator();
		atp.creation_date = ti->creation_date();
		atp.info_hashes = ti->info_hashes();
		atp.ti = std::move(ti);
	}
}